

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMalformedImages.cpp
# Opt level: O1

void anon_unknown.dwarf_1d259e::readBadBoundsImage(char *fileName)

{
  int iVar1;
  size_t sVar2;
  ostream *poVar3;
  RgbaInputFile in;
  RgbaInputFile local_50 [64];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"file ",5);
  if (fileName == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1f2f58);
  }
  else {
    sVar2 = strlen(fileName);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,fileName,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  std::ostream::flush();
  iVar1 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaInputFile::RgbaInputFile(local_50,fileName,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"version ",8);
  iVar1 = Imf_3_2::RgbaInputFile::version();
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  std::ostream::flush();
  Imf_3_2::RgbaInputFile::~RgbaInputFile(local_50);
  return;
}

Assistant:

void
readBadBoundsImage (const char fileName[])
{
    cout << "file " << fileName << " " << flush;

    OPENEXR_IMF_NAMESPACE::RgbaInputFile in (fileName);

    cout << "version " << in.version () << " " << flush;

    //const Box2i &dw = in.dataWindow();
}